

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_blockwise.hpp
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
utility::detail::
generate_block_bounds<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,detail *this,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *generator,
          size_t block_size,size_t range_length,int64_t min,int64_t max)

{
  result_type_conflict1 __x;
  vector<long,_std::allocator<long>_> *pvVar1;
  unsigned_long i;
  ulong uVar2;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar3;
  initializer_list<long> __l;
  longlong local_b8;
  vector<long,_std::allocator<long>_> *local_b0;
  double local_a8;
  int64_t max_local;
  vector<long,_std::allocator<long>_> bounds;
  urd_order_statistic_distribution<double> local_78;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  __l._M_len = 1;
  __l._M_array = (iterator)&local_78;
  local_b0 = __return_storage_ptr__;
  max_local = min;
  local_78.m_param.m_n = range_length;
  std::vector<long,_std::allocator<long>_>::vector(&bounds,__l,(allocator_type *)&local_b8);
  local_a8 = (double)min;
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0x3ff00000;
  plVar3 = generator;
  for (uVar2 = 0;
      uVar2 < block_size / (ulong)generator - (ulong)(block_size % (ulong)generator == 0);
      uVar2 = uVar2 + 1) {
    local_78.m_param.m_b = local_a8;
    local_78.m_uniform._M_param._M_a = (double)CONCAT44(uStack_44,local_48);
    local_78.m_uniform._M_param._M_b = (double)CONCAT44(uStack_3c,uStack_40);
    local_78.m_param.m_n = block_size;
    local_78.m_param.m_k = (size_t)plVar3;
    local_78.m_param.m_a = (double)(long)range_length;
    __x = urd_order_statistic_distribution<double>::operator()
                    (&local_78,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)this);
    local_b8 = llround(__x);
    std::vector<long,_std::allocator<long>_>::emplace_back<long>(&bounds,&local_b8);
    plVar3 = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             ((long)&generator->_M_x + (long)&plVar3->_M_x);
  }
  std::vector<long,_std::allocator<long>_>::push_back(&bounds,&max_local);
  pvVar1 = local_b0;
  (local_b0->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_start = bounds.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start;
  (local_b0->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = bounds.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
              ._M_finish;
  (local_b0->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       bounds.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  bounds.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  bounds.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  bounds.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&bounds.super__Vector_base<long,_std::allocator<long>_>);
  return pvVar1;
}

Assistant:

auto
            generate_block_bounds
            (
                URNG && generator,
                std::size_t block_size,
                std::size_t range_length,
                std::int64_t min,
                std::int64_t max
            )
        {
            const auto n = range_length;
            auto bounds = std::vector<std::int64_t>{min};

            const auto remainder = range_length % block_size;
            const auto block_count =
                range_length / block_size + static_cast<std::size_t>(remainder != 0);
            for (auto i = 0ul; i < block_count - 1; ++i)
            {
                const auto k = (i + 1) * block_size;

                auto osd =
                    utility::urd_order_statistic_distribution<double>
                    (
                        n,
                        k,
                        static_cast<double>(min),
                        static_cast<double>(max)
                    );
                const auto kth_stat = std::llround(osd(generator));

                bounds.push_back(kth_stat);
            }
            bounds.push_back(max);

            return bounds;
        }